

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

Error * ot::commissioner::ReadFile(Error *__return_storage_ptr__,string *aData,string *aFilename)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  __stream = fopen((aFilename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "cannot open file \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x19;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "cannot open file \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar4,"",&local_68);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar2);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x19;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"cannot open file \'{}\', {}",fmt,args);
      local_90 = kNotFound;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
    }
    else {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "cannot open file \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x19;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar4 = "cannot open file \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar4,"",&local_68);
        }
        pcVar4 = pcVar3;
      } while (pcVar3 != "");
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar2);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = (char *)0x19;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"cannot open file \'{}\', {}",fmt_00,args_00);
      local_90 = kIOError;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
    }
    __return_storage_ptr__->mCode = local_90;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  else {
    while( true ) {
      iVar1 = fgetc(__stream);
      if (iVar1 == -1) break;
      std::__cxx11::string::push_back((char)aData);
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ReadFile(std::string &aData, const std::string &aFilename)
{
    Error error;

    FILE *f = fopen(aFilename.c_str(), "r");

    if (f == nullptr)
    {
        if (errno == ENOENT)
        {
            ExitNow(error = ERROR_NOT_FOUND("cannot open file '{}', {}", aFilename, strerror(errno)));
        }
        else
        {
            ExitNow(error = ERROR_IO_ERROR("cannot open file '{}', {}", aFilename, strerror(errno)));
        }
    }

    while (true)
    {
        int c = fgetc(f);
        VerifyOrExit(c != EOF);
        aData.push_back(c);
    }

exit:
    if (f != nullptr)
    {
        fclose(f);
    }

    return error;
}